

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

bool perfetto::internal::TrackEventInternal::IsCategoryEnabled
               (TrackEventCategoryRegistry *registry,TrackEventConfig *config,Category *category)

{
  char *pcVar1;
  anon_class_24_3_89ee8aff callback;
  bool bVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar3;
  anon_class_16_2_063e518b local_138;
  function<bool_(const_char_*)> local_128;
  allocator<char> local_101;
  string local_100;
  anon_class_16_2_063e518b local_e0;
  function<bool_(const_char_*)> local_d0;
  allocator<char> local_99;
  string local_98;
  MatchType local_74;
  const_iterator pvStack_70;
  value_type match_type;
  const_iterator __end2;
  const_iterator __begin2;
  array<perfetto::internal::(anonymous_namespace)::MatchType,_2UL> *__range2;
  array<perfetto::internal::(anonymous_namespace)::MatchType,_2UL> match_types;
  anon_class_8_1_eaeee27c has_matching_tag;
  bool local_29;
  MatchType MStack_28;
  MatchType MStack_24;
  bool result;
  Category *category_local;
  TrackEventConfig *config_local;
  TrackEventCategoryRegistry *registry_local;
  
  _MStack_28 = (_Type)category;
  category_local = (Category *)config;
  config_local = (TrackEventConfig *)registry;
  bVar2 = Category::IsGroup(category);
  if (bVar2) {
    local_29 = false;
    callback.config = (TrackEventConfig *)category_local;
    callback.registry = (TrackEventCategoryRegistry *)config_local;
    callback.result = &local_29;
    Category::
    ForEachGroupMember<perfetto::internal::TrackEventInternal::IsCategoryEnabled(perfetto::internal::TrackEventCategoryRegistry_const&,perfetto::protos::gen::TrackEventConfig_const&,perfetto::Category_const&)::__2>
              ((Category *)_MStack_28,callback);
    registry_local._7_1_ = (bool)(local_29 & 1);
  }
  else {
    match_types._M_elems[0] = MStack_28;
    match_types._M_elems[1] = MStack_24;
    __range2 = (array<perfetto::internal::(anonymous_namespace)::MatchType,_2UL> *)0x100000000;
    __begin2 = (const_iterator)&__range2;
    __end2 = std::array<perfetto::internal::(anonymous_namespace)::MatchType,_2UL>::begin
                       ((array<perfetto::internal::(anonymous_namespace)::MatchType,_2UL> *)__begin2
                       );
    pvStack_70 = std::array<perfetto::internal::(anonymous_namespace)::MatchType,_2UL>::end
                           ((array<perfetto::internal::(anonymous_namespace)::MatchType,_2UL> *)
                            __begin2);
    for (; __end2 != pvStack_70; __end2 = __end2 + 1) {
      local_74 = *__end2;
      pvVar3 = protos::gen::TrackEventConfig::enabled_categories_abi_cxx11_
                         ((TrackEventConfig *)category_local);
      pcVar1 = *(char **)_MStack_28;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,pcVar1,&local_99);
      bVar2 = anon_unknown_17::NameMatchesPatternList(pvVar3,&local_98,local_74);
      ::std::__cxx11::string::~string((string *)&local_98);
      ::std::allocator<char>::~allocator(&local_99);
      if (bVar2) {
        return true;
      }
      local_e0.config = (TrackEventConfig *)category_local;
      local_e0.match_type = &local_74;
      ::std::function<bool(char_const*)>::
      function<perfetto::internal::TrackEventInternal::IsCategoryEnabled(perfetto::internal::TrackEventCategoryRegistry_const&,perfetto::protos::gen::TrackEventConfig_const&,perfetto::Category_const&)::__0,void>
                ((function<bool(char_const*)> *)&local_d0,&local_e0);
      bVar2 = IsCategoryEnabled::anon_class_8_1_eaeee27c::operator()
                        ((anon_class_8_1_eaeee27c *)&match_types,&local_d0);
      std::function<bool_(const_char_*)>::~function(&local_d0);
      if (bVar2) {
        return true;
      }
      pvVar3 = protos::gen::TrackEventConfig::disabled_categories_abi_cxx11_
                         ((TrackEventConfig *)category_local);
      pcVar1 = *(char **)_MStack_28;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_100,pcVar1,&local_101);
      bVar2 = anon_unknown_17::NameMatchesPatternList(pvVar3,&local_100,local_74);
      ::std::__cxx11::string::~string((string *)&local_100);
      ::std::allocator<char>::~allocator(&local_101);
      if (bVar2) {
        return false;
      }
      local_138.config = (TrackEventConfig *)category_local;
      local_138.match_type = &local_74;
      ::std::function<bool(char_const*)>::
      function<perfetto::internal::TrackEventInternal::IsCategoryEnabled(perfetto::internal::TrackEventCategoryRegistry_const&,perfetto::protos::gen::TrackEventConfig_const&,perfetto::Category_const&)::__1,void>
                ((function<bool(char_const*)> *)&local_128,&local_138);
      bVar2 = IsCategoryEnabled::anon_class_8_1_eaeee27c::operator()
                        ((anon_class_8_1_eaeee27c *)&match_types,&local_128);
      std::function<bool_(const_char_*)>::~function(&local_128);
      if (bVar2) {
        return false;
      }
    }
    registry_local._7_1_ = true;
  }
  return registry_local._7_1_;
}

Assistant:

bool TrackEventInternal::IsCategoryEnabled(
    const TrackEventCategoryRegistry& registry,
    const protos::gen::TrackEventConfig& config,
    const Category& category) {
  // If this is a group category, check if any of its constituent categories are
  // enabled. If so, then this one is enabled too.
  if (category.IsGroup()) {
    bool result = false;
    category.ForEachGroupMember([&](const char* member_name, size_t name_size) {
      for (size_t i = 0; i < registry.category_count(); i++) {
        const auto ref_category = registry.GetCategory(i);
        // Groups can't refer to other groups.
        if (ref_category->IsGroup())
          continue;
        // Require an exact match.
        if (ref_category->name_size() != name_size ||
            strncmp(ref_category->name, member_name, name_size)) {
          continue;
        }
        if (IsCategoryEnabled(registry, config, *ref_category)) {
          result = true;
          // Break ForEachGroupMember() loop.
          return false;
        }
        break;
      }
      // No match? Must be a dynamic category.
      DynamicCategory dyn_category(std::string(member_name, name_size));
      Category ref_category{Category::FromDynamicCategory(dyn_category)};
      if (IsCategoryEnabled(registry, config, ref_category)) {
        result = true;
        // Break ForEachGroupMember() loop.
        return false;
      }
      // No match found => keep iterating.
      return true;
    });
    return result;
  }

  auto has_matching_tag = [&](std::function<bool(const char*)> matcher) {
    for (const auto& tag : category.tags) {
      if (!tag)
        break;
      if (matcher(tag))
        return true;
    }
    // Legacy "disabled-by-default" categories automatically get the "slow" tag.
    if (!strncmp(category.name, kLegacySlowPrefix, strlen(kLegacySlowPrefix)) &&
        matcher(kSlowTag)) {
      return true;
    }
    return false;
  };

  // First try exact matches, then pattern matches.
  const std::array<MatchType, 2> match_types = {
      {MatchType::kExact, MatchType::kPattern}};
  for (auto match_type : match_types) {
    // 1. Enabled categories.
    if (NameMatchesPatternList(config.enabled_categories(), category.name,
                               match_type)) {
      return true;
    }

    // 2. Enabled tags.
    if (has_matching_tag([&](const char* tag) {
          return NameMatchesPatternList(config.enabled_tags(), tag, match_type);
        })) {
      return true;
    }

    // 3. Disabled categories.
    if (NameMatchesPatternList(config.disabled_categories(), category.name,
                               match_type)) {
      return false;
    }

    // 4. Disabled tags.
    if (has_matching_tag([&](const char* tag) {
          if (config.disabled_tags_size()) {
            return NameMatchesPatternList(config.disabled_tags(), tag,
                                          match_type);
          } else {
            // The "slow" and "debug" tags are disabled by default.
            return NameMatchesPattern(kSlowTag, tag, match_type) ||
                   NameMatchesPattern(kDebugTag, tag, match_type);
          }
        })) {
      return false;
    }
  }

  // If nothing matched, enable the category by default.
  return true;
}